

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall xercesc_4_0::TraverseSchema::traverseInclude(TraverseSchema *this,DOMElement *elem)

{
  SchemaInfo *pSVar1;
  SchemaInfo *pSVar2;
  RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *pRVar3;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_28;
  
  pSVar1 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_28.fScopeAdded = false;
  }
  else {
    local_28.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  pRVar3 = this->fPreprocessedNodes->fBucketList
           [(ulong)elem % this->fPreprocessedNodes->fHashModulus];
  do {
    local_28.fSchemaInfo = pSVar1;
    if (pRVar3 == (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0) {
LAB_003205c2:
      NamespaceScopeManager::~NamespaceScopeManager(&local_28);
      return;
    }
    if ((DOMElement *)pRVar3->fKey == elem) {
      pSVar1 = pRVar3->fData;
      if (pSVar1 != (SchemaInfo *)0x0) {
        pSVar2 = this->fSchemaInfo;
        this->fSchemaInfo = pSVar1;
        processChildren(this,pSVar1->fSchemaRootElement);
        this->fSchemaInfo = pSVar2;
      }
      goto LAB_003205c2;
    }
    pRVar3 = pRVar3->fNext;
  } while( true );
}

Assistant:

void TraverseSchema::traverseInclude(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaInfo* includeInfo = fPreprocessedNodes->get(elem);

    if (includeInfo) {

        SchemaInfo* saveInfo = fSchemaInfo;

        fSchemaInfo = includeInfo;
        processChildren(includeInfo->getRoot());
        fSchemaInfo = saveInfo;
    }
}